

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O2

int __thiscall MNS::Request::Parse(Request *this,ssize_t requestLen)

{
  char *__s;
  long lVar1;
  HTTP_VERSION HVar2;
  long lVar3;
  void *pvVar4;
  mapped_type *pmVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  byte bVar9;
  char *pcVar10;
  allocator local_51;
  key_type local_50;
  
  if (requestLen < 0) {
    iVar8 = (int)this->lastParsePos;
  }
  else {
    this->finished = false;
    this->lastParsePos = 0;
    iVar8 = 0;
    this->bufferLen = requestLen;
  }
  uVar6 = 0;
  this->state = PARSING_HEADERS;
  do {
    lVar7 = this->bufferLen;
    lVar3 = (long)iVar8;
    if (lVar7 - lVar3 == 0 || lVar7 < lVar3) {
      return 0;
    }
    if (4 < uVar6) {
      iVar8 = (int)lVar7;
      this->finished = true;
      goto LAB_0010b3b5;
    }
    pcVar10 = this->buffer;
    bVar9 = pcVar10[lVar3];
    __s = pcVar10 + lVar3;
    switch(uVar6) {
    case 0:
      switch(bVar9 & 0xdf) {
      case 0x43:
        this->method = CONNECT;
        goto LAB_0010b395;
      case 0x44:
        this->method = DELETE;
        iVar8 = iVar8 + 6;
        break;
      case 0x45:
      case 0x46:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
        break;
      case 0x47:
        this->method = GET;
        goto LAB_0010b3a2;
      case 0x48:
        this->method = HEAD;
LAB_0010b37b:
        iVar8 = iVar8 + 4;
        break;
      case 0x4f:
        this->method = OPTIONS;
LAB_0010b395:
        iVar8 = iVar8 + 7;
        break;
      case 0x50:
        if ((__s[1] & 0xdfU) != 0x55) {
          if ((__s[1] & 0xdfU) != 0x4f) {
            this->method = PATCH;
            goto LAB_0010b3af;
          }
          this->method = POST;
          goto LAB_0010b37b;
        }
        this->method = PUT;
LAB_0010b3a2:
        iVar8 = iVar8 + 3;
        break;
      default:
        if ((bVar9 & 0xdf) == 0x54) {
          this->method = TRACE;
LAB_0010b3af:
          iVar8 = iVar8 + 5;
        }
      }
      uVar6 = 1;
      break;
    case 1:
      this->url = __s;
      pvVar4 = memchr(__s,0x20,lVar7 - lVar3);
      if (pvVar4 == (void *)0x0) {
LAB_0010b3bc:
        this->state = NEED_MORE_DATA;
        return 1;
      }
      iVar8 = (int)pvVar4 - (int)pcVar10;
      pcVar10[iVar8] = '\0';
      iVar8 = iVar8 + 7;
      uVar6 = 2;
      break;
    case 2:
      HVar2 = HTTP_1_1;
      if (bVar9 == 0x31) {
LAB_0010b1d1:
        this->httpVersion = HVar2;
      }
      else if (bVar9 == 0x30) {
        HVar2 = HTTP_1_0;
        goto LAB_0010b1d1;
      }
      iVar8 = iVar8 + 2;
      goto LAB_0010b303;
    case 3:
      lVar7 = lVar3 << 0x20;
      while (bVar9 != 0x3a) {
        if ('@' < (char)bVar9) {
          pcVar10[lVar3] = bVar9 | 0x20;
          pcVar10 = this->buffer;
        }
        lVar1 = lVar3 + 1;
        lVar3 = lVar3 + 1;
        lVar7 = lVar7 + 0x100000000;
        bVar9 = pcVar10[lVar1];
      }
      pcVar10[lVar7 >> 0x20] = '\0';
      pcVar10 = this->buffer;
      lVar7 = (long)(int)((pcVar10[(lVar7 >> 0x20) + 1] == ' ') + 1 + (int)lVar3);
      pvVar4 = memchr(pcVar10 + lVar7,0xd,this->bufferLen - lVar7);
      if (pvVar4 == (void *)0x0) goto LAB_0010b3bc;
      iVar8 = (int)((long)pvVar4 - (long)pcVar10);
      pcVar10[iVar8] = '\0';
      std::__cxx11::string::string((string *)&local_50,__s,&local_51);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->headers,&local_50);
      std::__cxx11::string::assign((char *)pmVar5);
      iVar8 = iVar8 + 1;
      lVar7 = (long)pvVar4 - (long)pcVar10 << 0x20;
      std::__cxx11::string::~string((string *)&local_50);
      if ((this->buffer[lVar7 + 0x200000000 >> 0x20] == '\r') &&
         (this->buffer[lVar7 + 0x300000000 >> 0x20] == '\n')) {
        lVar7 = lVar7 + 0x400000000 >> 0x20;
        if ((this->method & ~OPTIONS) == GET) {
          if (lVar7 < this->bufferLen) {
            this->lastParsePos = lVar7;
            return 0;
          }
LAB_0010b3d4:
          this->finished = true;
          return 0;
        }
        uVar6 = 4;
        if (this->bufferLen <= lVar7) goto LAB_0010b3d4;
        break;
      }
LAB_0010b303:
      uVar6 = 3;
      break;
    case 4:
      lVar3 = (long)iVar8;
      iVar8 = iVar8 + 2;
      this->bodyBuffer = pcVar10 + lVar3 + 2;
      this->bodyBufferLen = lVar7 - (lVar3 + 2);
      uVar6 = 5;
    }
LAB_0010b3b5:
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int MNS::Request::Parse(ssize_t requestLen) {
	if(requestLen >= 0) {
		this->finished = false;
		this->lastParsePos = 0;
		this->bufferLen = requestLen;
	}

	char *tailPos = NULL;
	this->state = REQUEST_STATE::PARSING_HEADERS;
	
	PARSER_STATE parserState = PARSER_STATE::METHOD;

	for (int i = this->lastParsePos; i < this->bufferLen; i++) {
		char c = this->buffer[i];

		switch (parserState) {
			case PARSER_STATE::METHOD:
				if (c == 'G' || c == 'g') {
					this->method = HTTP_METHOD::GET;
					i += 3;
				} else if (c == 'O' || c == 'o') {
					this->method = HTTP_METHOD::OPTIONS;
					i += 7;
				} else if (c == 'P' || c == 'p') {
					char c1 = this->buffer[i + 1];
					if (c1 == 'O' || c1 == 'o') {
						this->method = HTTP_METHOD::POST;
						i += 4;
					} else if (c1 == 'U' || c1 == 'u') {
						this->method = HTTP_METHOD::PUT;
						i += 3;
					} else {
						this->method = HTTP_METHOD::PATCH;
						i += 5;
						// Todo: This may be unsafe and offset should be found
					}
				} else if (c == 'H' || c == 'h') {
					this->method = HTTP_METHOD::HEAD;
					i += 4;
				} else if (c == 'D' || c == 'd') {
					this->method = HTTP_METHOD::DELETE;
					i += 6;
				} else if (c == 'C' || c == 'c') {
					this->method = HTTP_METHOD::CONNECT;
					i += 7;
				} else if (c == 'T' || c == 't') {
					this->method = HTTP_METHOD::TRACE;
					i += 5;
				}

				parserState = PARSER_STATE::URL;
				break;
			case PARSER_STATE::URL:
				this->url = this->buffer + i;
				tailPos = (char*)memchr(this->url, ' ', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MROE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				}
				i = (int)(tailPos - this->buffer);
				buffer[i] = '\0';

				i += 7;
				parserState = PARSER_STATE::HTTP_VERSION;
				break;
			case PARSER_STATE::HTTP_VERSION:
				if (c == '1') this->httpVersion = HTTP_VERSION::HTTP_1_1;
				else if (c == '0') this->httpVersion = HTTP_VERSION::HTTP_1_0;
				parserState = PARSER_STATE::HEADER_NAME;
				i += 2;
				break;
			case PARSER_STATE::HEADER_NAME: {
				char *name = buffer + i;
				while (c != ':') {
					if (c >= 'A') buffer[i] |= 0x20;//-= 'A' - 'a';

					c = buffer[++i];
				}

				buffer[i] = '\0';
				i += (buffer[i + 1] == ' '?2:1);

				char *value = buffer + i;
				tailPos = (char *)memchr(buffer+i, '\r', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MORE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				} else {
					i = (int) (tailPos - buffer);
					buffer[i++] = '\0';
				}

				//this->headers[std::string(name, nameLen)] = std::string(value, valueLen);
				this->headers[name] = value;

				// Finished parsing headers
				if (buffer[i + 1] == '\r' && buffer[i + 2] == '\n') {
					// Possibility of pipelining
					if(this->method == HTTP_METHOD::GET || this->method == HTTP_METHOD::HEAD) {
						// More pipelined requests
						if(i + 3 < this->bufferLen) {
							this->lastParsePos = i+3;

							// Return back to handler
							return 0;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					} else {
						// Is request not drained
						if(i + 3 < this->bufferLen) {
							parserState = PARSER_STATE::BODY;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					}
				}

				break;
			}
			case PARSER_STATE::BODY:
				i += 2;
				// TODO: Copy the body into the message buffer to send to onData event
				this->bodyBuffer = buffer + i;
				this->bodyBufferLen = this->bufferLen - i;
				parserState = PARSER_STATE::FINISHED;
				break;
			default:
				i = this->bufferLen;
				this->finished = true;
				break;
		}
	}

	return 0;
}